

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool __thiscall
el::Configurations::parseFromFile
          (Configurations *this,string *configurationFile,Configurations *base)

{
  bool bVar1;
  ostream *poVar2;
  stringstream internalInfoStream;
  string local_1c0 [32];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  bVar1 = el::base::utils::File::pathExists((configurationFile->_M_dataplus)._M_p,false);
  if (bVar1) {
    bVar1 = Parser::parseFromFile(configurationFile,this,base);
    this->m_isFromFile = bVar1;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar2 = std::operator<<(local_190,"Configuration file [");
    poVar2 = std::operator<<(poVar2,(string *)configurationFile);
    std::operator<<(poVar2,"] does not exist!");
    poVar2 = std::operator<<((ostream *)&std::cerr,"ASSERTION FAILURE FROM EASYLOGGING++ (LINE: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0xd5);
    poVar2 = std::operator<<(poVar2,
                             ") [(assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true"
                            );
    poVar2 = std::operator<<(poVar2,"] WITH MESSAGE \"");
    std::__cxx11::stringbuf::str();
    poVar2 = std::operator<<(poVar2,local_1c0);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Configurations::parseFromFile(const std::string& configurationFile, Configurations* base) {
  // We initial assertion with true because if we have assertion diabled, we want to pass this
  // check and if assertion is enabled we will have values re-assigned any way.
  bool assertionPassed = true;
  ELPP_ASSERT((assertionPassed = base::utils::File::pathExists(configurationFile.c_str(), true)) == true,
              "Configuration file [" << configurationFile << "] does not exist!");
  if (!assertionPassed) {
    return false;
  }
  bool success = Parser::parseFromFile(configurationFile, this, base);
  m_isFromFile = success;
  return success;
}